

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_inv_m(REF_DBL *m,REF_DBL *inv_m)

{
  uint uVar1;
  REF_DBL inv [9];
  REF_DBL a [9];
  REF_DBL local_a8 [3];
  REF_DBL local_90;
  REF_DBL local_88;
  REF_DBL local_78;
  REF_DBL local_70;
  REF_DBL local_68;
  REF_DBL local_58;
  REF_DBL local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  REF_DBL local_30;
  REF_DBL local_28;
  REF_DBL local_20;
  REF_DBL local_18;
  
  local_58 = *m;
  local_50 = m[1];
  local_48 = m[2];
  local_38 = m[3];
  local_30 = m[4];
  local_18 = m[5];
  local_40 = local_50;
  local_28 = local_48;
  local_20 = local_30;
  uVar1 = ref_matrix_inv_gen(3,&local_58,local_a8);
  if (uVar1 == 0) {
    *inv_m = local_a8[0];
    inv_m[1] = local_90;
    inv_m[2] = local_78;
    inv_m[3] = local_88;
    inv_m[4] = local_70;
    inv_m[5] = local_68;
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x1eb,
           "ref_matrix_inv_m",(ulong)uVar1,"general inverse");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_inv_m(REF_DBL *m, REF_DBL *inv_m) {
  /* the general inv has better stability by avoiding det */
  REF_DBL a[9], inv[9];

  RSS(ref_matrix_m_full(m, a), "full");
  RSS(ref_matrix_inv_gen(3, a, inv), "general inverse");
  RSS(ref_matrix_full_m(inv, inv_m), "full");

  return REF_SUCCESS;
}